

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_vector_quantity.cpp
# Opt level: O0

string * __thiscall
polyscope::SurfaceFaceTangentVectorQuantity::niceName_abi_cxx11_
          (SurfaceFaceTangentVectorQuantity *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  char *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  string local_50 [12];
  int in_stack_ffffffffffffffbc;
  string local_30 [48];
  
  if ((int)in_RSI[0x2d]._M_string_length == 1) {
    std::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  }
  else {
    std::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    std::__cxx11::to_string(in_stack_ffffffffffffffbc);
    std::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    std::operator+(in_RSI,(char *)in_RDI);
    std::__cxx11::string::~string(local_30);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
    std::__cxx11::string::~string(local_50);
  }
  return in_RDI;
}

Assistant:

std::string SurfaceFaceTangentVectorQuantity::niceName() {
  if (nSym == 1) {
    return name + " (face tangent vector)";
  } else {
    return name + " (face tangent vector sym=" + std::to_string(nSym) + ")";
  }
}